

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  BCLine BVar6;
  uint uVar7;
  char *pcVar8;
  GCtab *t;
  TValue *pTVar9;
  uint32_t uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  GCfunc *fn;
  char cVar15;
  cTValue *local_50;
  
  if (*what == '>') {
    uVar11 = L->top[-1].u32.lo;
    L->top = L->top + -1;
    what = what + 1;
    local_50 = (cTValue *)0x0;
    pTVar9 = (TValue *)0x0;
  }
  else {
    uVar11 = ar->i_ci;
    pTVar9 = (TValue *)((ulong)(L->stack).ptr32 + (ulong)(uVar11 & 0xffff) * 8);
    local_50 = (TValue *)0x0;
    if (0xffff < uVar11) {
      local_50 = pTVar9 + (uVar11 >> 0x10);
    }
    uVar11 = (pTVar9->u32).lo;
  }
  fn = (GCfunc *)(ulong)uVar11;
  bVar4 = false;
  bVar5 = false;
  do {
    bVar1 = *what;
    if (bVar1 < 0x6c) {
      if (bVar1 < 0x53) {
        if (bVar1 != 0x4c) {
          if (bVar1 != 0) {
            return 0;
          }
          if (bVar5) {
            pTVar9 = L->top;
            (pTVar9->u32).lo = uVar11;
            (pTVar9->field_2).it = 0xfffffff7;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
              lj_state_growstack(L,1);
            }
          }
          if (bVar4) {
            if ((fn->c).ffid == '\0') {
              t = lj_tab_new(L,0,0);
              uVar14 = (ulong)(fn->c).pc.ptr32;
              uVar13 = (ulong)*(uint *)(uVar14 - 0xc);
              if (uVar13 != 0) {
                cVar15 = '\x01';
                if (0xff < *(int *)(uVar14 - 0x10)) {
                  cVar15 = (0xffff < *(int *)(uVar14 - 0x10)) * '\x02' + '\x02';
                }
                uVar11 = *(int *)(uVar14 - 0x38) - 1;
                if (uVar11 != 0) {
                  iVar2 = *(int *)(uVar14 - 0x14);
                  uVar14 = 0;
                  do {
                    if (cVar15 == '\x02') {
                      uVar7 = (uint)*(ushort *)(uVar13 + uVar14 * 2);
                    }
                    else if (cVar15 == '\x01') {
                      uVar7 = (uint)*(byte *)(uVar13 + uVar14);
                    }
                    else {
                      uVar7 = *(uint *)(uVar13 + uVar14 * 4);
                    }
                    lVar12 = (long)(int)uVar7 + (long)iVar2;
                    uVar7 = (uint)lVar12;
                    if (uVar7 < t->asize) {
                      pTVar9 = (TValue *)((ulong)(t->array).ptr32 + lVar12 * 8);
                    }
                    else {
                      pTVar9 = lj_tab_setinth(L,t,uVar7);
                    }
                    (pTVar9->field_2).it = 0xfffffffd;
                    uVar14 = uVar14 + 1;
                  } while (uVar11 != uVar14);
                }
              }
              pTVar9 = L->top;
              (pTVar9->u32).lo = (uint32_t)t;
              uVar10 = 0xfffffff4;
            }
            else {
              pTVar9 = L->top;
              uVar10 = 0xffffffff;
            }
            (pTVar9->field_2).it = uVar10;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
              lj_state_growstack(L,1);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        bVar4 = true;
      }
      else if (bVar1 == 0x53) {
        if ((fn->c).ffid == '\0') {
          uVar14 = (ulong)(fn->c).pc.ptr32;
          uVar7 = *(uint *)(uVar14 - 0x18);
          iVar2 = *(int *)(uVar14 - 0x14);
          ar->source = (char *)((GCstr *)(ulong)uVar7 + 1);
          lj_debug_shortname(ar->short_src,(GCstr *)(ulong)uVar7);
          ar->linedefined = iVar2;
          iVar3 = *(int *)(uVar14 - 0x10);
          ar->lastlinedefined = iVar3 + iVar2;
          pcVar8 = "main";
          if (iVar3 == 0) {
            pcVar8 = "Lua";
          }
          if (iVar2 != 0) {
            pcVar8 = "Lua";
          }
        }
        else {
          ar->source = "=[C]";
          builtin_strncpy(ar->short_src,"[C]",4);
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar8 = "C";
        }
        ar->what = pcVar8;
      }
      else {
        bVar5 = true;
        if (bVar1 != 0x66) {
          return 0;
        }
      }
    }
    else if (bVar1 == 0x6c) {
      if (pTVar9 == (TValue *)0x0) {
        BVar6 = -1;
      }
      else {
        BVar6 = debug_frameline(L,fn,local_50);
      }
      ar->currentline = BVar6;
    }
    else if (bVar1 == 0x6e) {
      if (pTVar9 != (TValue *)0x0) {
        pcVar8 = lj_debug_funcname(L,pTVar9,&ar->name);
        ar->namewhat = pcVar8;
        if (pcVar8 != (char *)0x0) goto LAB_0010d6f1;
      }
      ar->namewhat = "";
      ar->name = (char *)0x0;
    }
    else {
      if (bVar1 != 0x75) {
        return 0;
      }
      ar->nups = (uint)(fn->c).nupvalues;
      if (ext != 0) {
        if ((fn->c).ffid == '\0') {
          uVar14 = (ulong)(fn->c).pc.ptr32;
          ar->nparams = (uint)*(byte *)(uVar14 - 0x3a);
          ar->isvararg = *(byte *)(uVar14 - 0x1b) >> 1 & 1;
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
LAB_0010d6f1:
    what = (char *)((byte *)what + 1);
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    api_check(L, tvisfunc(func));
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lua_assert(offset != 0);
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lua_assert(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)));
    fn = frame_func(frame);
    lua_assert(fn->c.gct == ~LJ_TFUNC);
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}